

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::on_inactivity_tick(torrent *this,error_code *ec)

{
  bool bVar1;
  session_settings *this_00;
  bool is_inactive;
  error_code *ec_local;
  torrent *this_local;
  
  *(uint *)&this->field_0x5d8 = *(uint *)&this->field_0x5d8 & 0xfbffffff;
  bVar1 = boost::system::error_code::operator_cast_to_bool(ec);
  if ((!bVar1) &&
     (bVar1 = is_inactive_internal(this), (uint)bVar1 != (*(uint *)&this->field_0x600 >> 6 & 1))) {
    *(uint *)&this->field_0x600 = *(uint *)&this->field_0x600 & 0xffffffbf | (uint)bVar1 << 6;
    update_state_list(this);
    update_want_tick(this);
    this_00 = settings(this);
    bVar1 = session_settings::get_bool(this_00,0x800d);
    if (bVar1) {
      (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x2c]
      )();
    }
  }
  return;
}

Assistant:

void torrent::on_inactivity_tick(error_code const& ec) try
	{
		m_pending_active_change = false;

		if (ec) return;

		bool const is_inactive = is_inactive_internal();
		if (is_inactive == m_inactive) return;

		m_inactive = is_inactive;

		update_state_list();
		update_want_tick();

		if (settings().get_bool(settings_pack::dont_count_slow_torrents))
			m_ses.trigger_auto_manage();
	}
	catch (...) { handle_exception(); }